

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  int cell_edge;
  int iVar4;
  
  if (ref_cell->edge_per < 1) {
    RVar3 = 0;
  }
  else {
    RVar3 = 0;
    iVar4 = 1;
    cell_edge = 0;
    do {
      pRVar1 = ref_subdiv->mark;
      RVar2 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,cell);
      RVar3 = RVar3 + pRVar1[RVar2] * iVar4;
      iVar4 = iVar4 * 2;
      cell_edge = cell_edge + 1;
    } while (cell_edge < ref_cell->edge_per);
  }
  return RVar3;
}

Assistant:

static REF_INT ref_subdiv_map(REF_SUBDIV ref_subdiv, REF_CELL ref_cell,
                              REF_INT cell) {
  REF_INT edge, map, bit;

  map = 0;
  bit = 1;
  for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++) {
    map +=
        bit * ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell));
    bit *= 2;
  }

  return map;
}